

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cirs2gal.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  double dVar2;
  CESkyCoord gal_coord;
  CESkyCoord cirs_coord;
  CEDate date;
  CEExecOptions opts;
  CEExecOptions *in_stack_fffffffffffffb70;
  CLOptions *in_stack_fffffffffffffb78;
  CLOptions *this;
  CEObserver local_450 [176];
  CEDate local_3a0 [48];
  CESkyCoordType local_370;
  allocator<char> local_369;
  string local_368 [32];
  CEExecOptions *local_348;
  CEAngle local_340 [23];
  allocator local_329;
  string local_328 [32];
  double local_308;
  CEAngle local_300 [16];
  CESkyCoord local_2f0 [8];
  CESkyCoord *in_stack_fffffffffffffd18;
  CEExecOptions *in_stack_fffffffffffffd20;
  allocator local_2b9;
  string local_2b8 [32];
  CEDate local_298 [64];
  undefined4 local_258;
  char **in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe74;
  CLOptions *in_stack_fffffffffffffe78;
  
  DefineOpts();
  bVar1 = CLOptions::ParseCommandLine
                    (in_stack_fffffffffffffe78,in_stack_fffffffffffffe74,in_stack_fffffffffffffe68);
  if (bVar1) {
    local_258 = 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2b8,"juliandate",&local_2b9);
    dVar2 = CLOptions::AsDouble(in_stack_fffffffffffffb78,(string *)in_stack_fffffffffffffb70);
    CEDate::CEDate(local_298,dVar2,JD);
    std::__cxx11::string::~string(local_2b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_328,"ra",&local_329);
    local_308 = CLOptions::AsDouble(in_stack_fffffffffffffb78,(string *)in_stack_fffffffffffffb70);
    CEAngle::Deg((double *)local_300);
    this = (CLOptions *)&local_369;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_368,"dec",(allocator *)this);
    in_stack_fffffffffffffb70 =
         (CEExecOptions *)CLOptions::AsDouble(this,(string *)in_stack_fffffffffffffb70);
    local_348 = in_stack_fffffffffffffb70;
    CEAngle::Deg((double *)local_340);
    local_370 = CIRS;
    CESkyCoord::CESkyCoord(local_2f0,local_300,local_340,&local_370);
    CEAngle::~CEAngle(local_340);
    std::__cxx11::string::~string(local_368);
    std::allocator<char>::~allocator(&local_369);
    CEAngle::~CEAngle(local_300);
    std::__cxx11::string::~string(local_328);
    std::allocator<char>::~allocator((allocator<char> *)&local_329);
    CEObserver::CEObserver(local_450);
    CESkyCoord::ConvertToGalactic(local_3a0,(CEObserver *)local_2f0);
    CEObserver::~CEObserver(local_450);
    PrintResults(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    local_258 = 1;
    CESkyCoord::~CESkyCoord((CESkyCoord *)local_3a0);
    CESkyCoord::~CESkyCoord(local_2f0);
    CEDate::~CEDate(local_298);
  }
  CEExecOptions::~CEExecOptions(in_stack_fffffffffffffb70);
  return 0;
}

Assistant:

int main(int argc, char** argv) 
{    
    // Get the options from the command line
    CEExecOptions opts = DefineOpts();
    if (opts.ParseCommandLine(argc, argv)) return 0;
    
    // Convert the coordinates
    CEDate date(opts.AsDouble("juliandate"), CEDateType::JD);
    CESkyCoord cirs_coord(CEAngle::Deg(opts.AsDouble("ra")),
                          CEAngle::Deg(opts.AsDouble("dec")),
                          CESkyCoordType::CIRS);
    CESkyCoord gal_coord = cirs_coord.ConvertToGalactic(date);
    
    // Print the results
    PrintResults(opts, gal_coord);
    
    return 0 ;
}